

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O0

void __thiscall
Inter_Symbol_Generator::matrix_copy_to
          (Inter_Symbol_Generator *this,uint8_t **src,uint32_t row,uint32_t col,uint8_t **dst,
          uint32_t r_pos,uint32_t c_pos)

{
  uint32_t local_34;
  uint local_30;
  uint32_t j;
  uint32_t i;
  uint32_t r_pos_local;
  uint8_t **dst_local;
  uint32_t col_local;
  uint32_t row_local;
  uint8_t **src_local;
  Inter_Symbol_Generator *this_local;
  
  for (local_30 = r_pos; local_30 < r_pos + row; local_30 = local_30 + 1) {
    for (local_34 = c_pos; local_34 < c_pos + col; local_34 = local_34 + 1) {
      dst[local_30][local_34] = src[local_30 - r_pos][local_34 - c_pos];
    }
  }
  return;
}

Assistant:

void Inter_Symbol_Generator::matrix_copy_to(uint8_t **src, uint32_t row, uint32_t col, uint8_t **dst, uint32_t r_pos, uint32_t c_pos)
{
	uint32_t i = 0;
	uint32_t j = 0;

	for (i = r_pos; i < r_pos + row; i++)
	{
		for (j = c_pos; j < c_pos + col; j++)
		{
			dst[i][j] = src[i - r_pos][j - c_pos];
			//std::cout << i << " " << j << std::endl;
		}
	}
}